

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmaes.cpp
# Opt level: O2

Optimizer * createCMAES(string *configFile)

{
  long lVar1;
  Ptr this;
  string local_38;
  
  this._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
  super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.super__Head_base<0UL,_Cmaes_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<Cmaes,_std::default_delete<Cmaes>,_true,_true>)operator_new(0x1c0);
  std::__cxx11::string::string((string *)&local_38,(string *)configFile);
  Cmaes::Cmaes((Cmaes *)this._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
                        super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
                        super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl,&local_38);
  if ((__uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>)
      cmaesOptimizer._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
      super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
      super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>)0x0) {
    lVar1 = *(long *)cmaesOptimizer._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>.
                     _M_t.super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
                     super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl;
    cmaesOptimizer._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
    super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
    super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl =
         this._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
         super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
         super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl;
    (**(code **)(lVar1 + 0x28))();
    this._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
    super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
    super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl =
         cmaesOptimizer._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
         super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
         super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl;
  }
  cmaesOptimizer._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
  super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.super__Head_base<0UL,_Cmaes_*,_false>
  ._M_head_impl =
       this._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
       super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
       super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl;
  std::__cxx11::string::~string((string *)&local_38);
  return (Optimizer *)
         (__uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>)
         cmaesOptimizer._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
         super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
         super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl;
}

Assistant:

Optimizer* createCMAES(std::string configFile) 
{
    cmaesOptimizer.reset(new Cmaes(configFile));
    return cmaesOptimizer.get();
}